

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O0

void Fxch_CubesUnGruping(Fxch_Man_t *pFxchMan)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *vVec1;
  int local_3c;
  int nOnes;
  int *pOutputID;
  Vec_Int_t *vNewCube;
  Vec_Int_t *vCube;
  int local_18;
  int j;
  int i;
  int iCube;
  Fxch_Man_t *pFxchMan_local;
  
  iVar1 = Vec_WecSize(pFxchMan->vCubes);
  iVar2 = Vec_IntSize(pFxchMan->vOutputID);
  if (iVar1 == iVar2 / pFxchMan->nSizeOutputID) {
    for (j = 0; iVar1 = Vec_WecSize(pFxchMan->vCubes), j < iVar1; j = j + 1) {
      p = Vec_WecEntry(pFxchMan->vCubes,j);
      iVar1 = Vec_IntSize(p);
      if ((iVar1 != 0) && (iVar1 = Vec_IntEntry(p,0), iVar1 == 0)) {
        piVar3 = Vec_IntEntryP(pFxchMan->vOutputID,j * pFxchMan->nSizeOutputID);
        local_3c = 0;
        for (local_18 = 0; local_18 < pFxchMan->nSizeOutputID; local_18 = local_18 + 1) {
          iVar1 = Fxch_CountOnes(piVar3[local_18]);
          local_3c = iVar1 + local_3c;
        }
        for (local_18 = 0; local_18 < pFxchMan->nSizeOutputID && local_3c != 0;
            local_18 = local_18 + 1) {
          for (vCube._4_4_ = 0; (int)vCube._4_4_ < 0x20 && local_3c != 0;
              vCube._4_4_ = vCube._4_4_ + 1) {
            if ((piVar3[local_18] & 1 << ((byte)vCube._4_4_ & 0x1f)) != 0) {
              if (local_3c == 1) {
                iVar1 = Vec_IntEntry(pFxchMan->vTranslation,local_18 << 5 | vCube._4_4_);
                Vec_IntWriteEntry(p,0,iVar1);
              }
              else {
                vVec1 = Vec_WecPushLevel(pFxchMan->vCubes);
                Vec_IntAppend(vVec1,p);
                iVar1 = Vec_IntEntry(pFxchMan->vTranslation,local_18 << 5 | vCube._4_4_);
                Vec_IntWriteEntry(vVec1,0,iVar1);
              }
              local_3c = local_3c + -1;
            }
          }
        }
      }
    }
    Vec_IntFree(pFxchMan->vTranslation);
    Vec_IntFree(pFxchMan->vOutputID);
    if (pFxchMan->pTempOutputID != (int *)0x0) {
      free(pFxchMan->pTempOutputID);
      pFxchMan->pTempOutputID = (int *)0x0;
    }
    return;
  }
  __assert_fail("Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID )"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/Fxch.c"
                ,0x71,"void Fxch_CubesUnGruping(Fxch_Man_t *)");
}

Assistant:

void Fxch_CubesUnGruping(Fxch_Man_t* pFxchMan)
{
    int iCube;
    int i, j;
    Vec_Int_t* vCube;
    Vec_Int_t* vNewCube;

    assert( Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID ) );
    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        int * pOutputID, nOnes;
        if ( Vec_IntSize( vCube ) == 0 || Vec_IntEntry( vCube, 0 ) != 0 )
            continue;

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( i = 0; i < pFxchMan->nSizeOutputID; i++ )
            nOnes += Fxch_CountOnes( (unsigned int) pOutputID[i] );

        for ( i = 0; i < pFxchMan->nSizeOutputID && nOnes; i++ )
            for ( j = 0; j < 32 && nOnes; j++ )
                if ( pOutputID[i] & ( 1 << j ) )
                {
                    if ( nOnes == 1 )
                        Vec_IntWriteEntry( vCube, 0, Vec_IntEntry( pFxchMan->vTranslation, ( i << 5 ) | j ) );
                    else
                    {
                        vNewCube = Vec_WecPushLevel( pFxchMan->vCubes );
                        Vec_IntAppend( vNewCube, vCube );
                        Vec_IntWriteEntry( vNewCube, 0, Vec_IntEntry( pFxchMan->vTranslation, (i << 5 ) | j ) );
                    }
                    nOnes -= 1;
                }
    }

    Vec_IntFree( pFxchMan->vTranslation );
    Vec_IntFree( pFxchMan->vOutputID );
    ABC_FREE( pFxchMan->pTempOutputID );
    return;
}